

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb_ResetToDepth(leb_Heap *leb,int depth)

{
  uint32_t nodeID;
  ulong uVar1;
  
  if (depth < leb->minDepth) {
    __assert_fail("depth >= leb->minDepth && \"depth must be at least equal to minDepth\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x270,"void leb_ResetToDepth(leb_Heap *, int)");
  }
  if (depth <= leb->maxDepth) {
    memset(leb->buffer,0,(ulong)((uint)(1 << ((char)leb->maxDepth + 2U & 0x1f)) >> 3 & 0xfffffffc));
    for (uVar1 = (ulong)(uint)(1 << ((byte)depth & 0x1f)); uVar1 < (uint)(2 << ((byte)depth & 0x1f))
        ; uVar1 = uVar1 + 1) {
      leb__HeapWrite_BitField(leb,(leb_Node)(((ulong)(uint)depth << 0x20) + uVar1),1);
    }
    leb_ComputeSumReduction(leb);
    return;
  }
  __assert_fail("depth <= leb->maxDepth && \"depth must be at most equal to maxDepth\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x271,"void leb_ResetToDepth(leb_Heap *, int)");
}

Assistant:

LEBDEF void leb_ResetToDepth(leb_Heap *leb, int depth)
{
    LEB_ASSERT(depth >= leb->minDepth && "depth must be at least equal to minDepth");
    LEB_ASSERT(depth <= leb->maxDepth && "depth must be at most equal to maxDepth");
    uint32_t minNodeID = 1u << depth;
    uint32_t maxNodeID = 2u << depth;

    leb__ClearBuffer(leb);

    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; ++nodeID) {
        leb_Node node = {nodeID, depth};

        leb__HeapWrite_BitField(leb, node, 1u);
    }

    leb_ComputeSumReduction(leb);
}